

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkreplyhttpimpl.cpp
# Opt level: O3

Operation __thiscall
QNetworkReplyHttpImplPrivate::getRedirectOperation
          (QNetworkReplyHttpImplPrivate *this,Operation currentOp,int httpStatus)

{
  Operation OVar1;
  
  OVar1 = (currentOp != HeadOperation) + HeadOperation;
  if (httpStatus - 0x133U < 2) {
    OVar1 = currentOp;
  }
  return OVar1;
}

Assistant:

QNetworkAccessManager::Operation QNetworkReplyHttpImplPrivate::getRedirectOperation(QNetworkAccessManager::Operation currentOp, int httpStatus)
{
    // HTTP status code can be used to decide if we can redirect with a GET
    // operation or not. See http://www.ietf.org/rfc/rfc2616.txt [Sec 10.3] for
    // more details

    // We MUST keep using the verb that was used originally when being redirected with 307 or 308.
    if (httpStatus == 307 || httpStatus == 308)
        return currentOp;

    switch (currentOp) {
    case QNetworkAccessManager::HeadOperation:
        return QNetworkAccessManager::HeadOperation;
    default:
        break;
    }
    // Use GET for everything else.
    return QNetworkAccessManager::GetOperation;
}